

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::ast::NetAliasVisitor&>
          (ConditionalExpression *this,NetAliasVisitor *visitor)

{
  pointer pCVar1;
  size_t sVar2;
  long lVar3;
  
  pCVar1 = (this->conditions)._M_ptr;
  sVar2 = (this->conditions)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    Expression::visit<slang::ast::NetAliasVisitor&>
              (*(Expression **)((long)&(pCVar1->expr).ptr + lVar3),visitor);
  }
  Expression::visit<slang::ast::NetAliasVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::NetAliasVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }

        left().visit(visitor);
        right().visit(visitor);
    }